

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

void __thiscall duckdb_snappy::SnappyIOVecReader::Skip(SnappyIOVecReader *this,size_t n)

{
  ulong in_RSI;
  SnappyIOVecReader *in_RDI;
  ulong local_10;
  
  local_10 = in_RSI;
  while (in_RDI->curr_size_remaining_ <= local_10 && local_10 != 0) {
    local_10 = local_10 - in_RDI->curr_size_remaining_;
    Advance(in_RDI);
  }
  in_RDI->curr_size_remaining_ = in_RDI->curr_size_remaining_ - local_10;
  in_RDI->total_size_remaining_ = in_RDI->total_size_remaining_ - local_10;
  in_RDI->curr_pos_ = in_RDI->curr_pos_ + local_10;
  return;
}

Assistant:

void Skip(size_t n) override {
    while (n >= curr_size_remaining_ && n > 0) {
      n -= curr_size_remaining_;
      Advance();
    }
    curr_size_remaining_ -= n;
    total_size_remaining_ -= n;
    curr_pos_ += n;
  }